

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

char * __thiscall tinyxml2::XMLElement::GetText(XMLElement *this)

{
  XMLNode *this_00;
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar2;
  XMLNode **ppXVar3;
  
  ppXVar3 = &(this->super_XMLNode)._firstChild;
  while( true ) {
    this_00 = *ppXVar3;
    if (this_00 == (XMLNode *)0x0) {
      return (char *)0x0;
    }
    iVar1 = (*this_00->_vptr_XMLNode[8])(this_00);
    if (CONCAT44(extraout_var,iVar1) == 0) break;
    ppXVar3 = &this_00->_next;
  }
  iVar1 = (*this_00->_vptr_XMLNode[7])(this_00);
  if (CONCAT44(extraout_var_00,iVar1) == 0) {
    return (char *)0x0;
  }
  pcVar2 = XMLNode::Value(this_00);
  return pcVar2;
}

Assistant:

const char* XMLElement::GetText() const
{
    /* skip comment node */
    const XMLNode* node = FirstChild();
    while (node) {
        if (node->ToComment()) {
            node = node->NextSibling();
            continue;
        }
        break;
    }

    if ( node && node->ToText() ) {
        return node->Value();
    }
    return 0;
}